

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O2

int __thiscall
QTextMarkdownImporter::cbLeaveSpan(QTextMarkdownImporter *this,int spanType,void *detail)

{
  QArrayDataPointer<char16_t> *this_00;
  bool bVar1;
  int t;
  iterator iVar2;
  QDebug *pQVar3;
  char *t_00;
  long in_FS_OFFSET;
  undefined1 local_c8 [32];
  QArrayDataPointer<QString> local_a8;
  undefined4 local_90;
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined4 local_7c;
  char *local_78;
  QDebug local_70;
  QFont local_68;
  QTextFormat local_58;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_48);
  if ((this->m_spanFormatStack).super_QList<QTextCharFormat>.d.size != 0) {
    QList<QTextCharFormat>::takeLast((QList<QTextCharFormat> *)&local_58);
    QTextFormat::~QTextFormat(&local_58);
    if ((this->m_spanFormatStack).super_QList<QTextCharFormat>.d.size != 0) {
      iVar2 = QList<QTextCharFormat>::end(&(this->m_spanFormatStack).super_QList<QTextCharFormat>);
      QTextFormat::operator=((QTextFormat *)local_48,&iVar2.i[-1].super_QTextFormat);
    }
  }
  QTextCursor::setCharFormat(&this->m_cursor,(QTextCharFormat *)local_48);
  lcMD();
  if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_90 = 2;
    local_8c = 0;
    uStack_84 = 0;
    local_7c = 0;
    local_78 = lcMD::category.name;
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<(&local_70,spanType);
    pQVar3 = QDebug::operator<<(pQVar3,"setCharFormat");
    QTextCharFormat::font((QTextCharFormat *)&local_68);
    QFont::families((QStringList *)&local_a8,&local_68);
    pQVar3 = QDebug::operator<<(pQVar3,local_a8.ptr);
    t = QTextCharFormat::fontWeight((QTextCharFormat *)local_48);
    pQVar3 = QDebug::operator<<(pQVar3,t);
    bVar1 = QTextCharFormat::fontItalic((QTextCharFormat *)local_48);
    t_00 = "";
    if (bVar1) {
      t_00 = "italic";
    }
    pQVar3 = QDebug::operator<<(pQVar3,t_00);
    QTextFormat::foreground((QTextFormat *)local_c8);
    this_00 = (QArrayDataPointer<char16_t> *)(local_c8 + 8);
    QColor::name((QString *)this_00,(QColor *)(local_c8._0_8_ + 8),HexRgb);
    QDebug::operator<<(pQVar3,(QString *)this_00);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
    QBrush::~QBrush((QBrush *)local_c8);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
    QFont::~QFont(&local_68);
    QDebug::~QDebug(&local_70);
  }
  if (spanType == 3) {
    this->m_imageSpan = false;
  }
  QTextFormat::~QTextFormat((QTextFormat *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int QTextMarkdownImporter::cbLeaveSpan(int spanType, void *detail)
{
    Q_UNUSED(detail);
    QTextCharFormat charFmt;
    if (!m_spanFormatStack.isEmpty()) {
        m_spanFormatStack.pop();
        if (!m_spanFormatStack.isEmpty())
            charFmt = m_spanFormatStack.top();
    }
    m_cursor.setCharFormat(charFmt);
    qCDebug(lcMD) << spanType << "setCharFormat" << charFmt.font().families().constFirst()
                  << charFmt.fontWeight() << (charFmt.fontItalic() ? "italic" : "")
                  << charFmt.foreground().color().name();
    if (spanType == int(MD_SPAN_IMG))
        m_imageSpan = false;
    return 0; // no error
}